

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int setcharset(uchar **p,uchar *charset)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  byte bVar5;
  byte local_28;
  byte local_26;
  byte local_25;
  undefined4 uStack_24;
  char c2;
  uchar c;
  _Bool something_found;
  uchar lastchar;
  uchar rangestart;
  setcharset_state state;
  uchar *charset_local;
  uchar **p_local;
  
  uStack_24 = 0;
  local_25 = 0;
  local_26 = 0;
  bVar2 = false;
  do {
    local_28 = **p;
    switch(uStack_24) {
    case 0:
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)(uint)local_28] & 8) == 0) {
        if (local_28 == 0x5d) {
          if (bVar2) {
            return 1;
          }
          bVar2 = true;
          uStack_24 = 3;
          charset[0x5d] = '\x01';
          *p = *p + 1;
        }
        else if (local_28 == 0x5b) {
          if ((*p)[1] == ':') {
            *p = *p + 2;
            iVar3 = parsekeyword(p,charset);
            if (iVar3 == 0) {
              return 0;
            }
            uStack_24 = 0;
          }
          else {
            charset[0x5b] = '\x01';
            *p = *p + 1;
          }
          bVar2 = true;
        }
        else if ((local_28 == 0x3f) || (local_28 == 0x2a)) {
          bVar2 = true;
          charset[local_28] = '\x01';
          *p = *p + 1;
        }
        else if ((local_28 == 0x5e) || (local_28 == 0x21)) {
          if (bVar2) {
            charset[local_28] = '\x01';
          }
          else if (charset[0x100] == '\0') {
            charset[0x100] = '\x01';
          }
          else {
            charset[local_28] = '\x01';
            bVar2 = true;
          }
          *p = *p + 1;
        }
        else {
          if (local_28 == 0x5c) {
            puVar1 = *p;
            *p = puVar1 + 1;
            local_25 = puVar1[1];
            ppuVar4 = __ctype_b_loc();
            if (((*ppuVar4)[(int)(uint)local_25] & 0x4000) == 0) {
              return 0;
            }
            uStack_24 = 1;
            charset[local_25] = '\x01';
            *p = *p + 1;
          }
          else {
            if (local_28 == 0) {
              return 0;
            }
            charset[local_28] = '\x01';
            *p = *p + 1;
          }
          bVar2 = true;
        }
      }
      else {
        charset[local_28] = '\x01';
        *p = *p + 1;
        uStack_24 = 1;
        bVar2 = true;
        local_25 = local_28;
      }
      break;
    case 1:
      if (local_28 == 0x2d) {
        charset[0x2d] = '\x01';
        *p = *p + 1;
        local_26 = 0x2d;
        uStack_24 = 2;
      }
      else if (local_28 == 0x5b) {
        uStack_24 = 0;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)(uint)local_28] & 8) == 0) {
          if (local_28 != 0x5c) {
            if (local_28 == 0x5d) {
              return 1;
            }
            return 0;
          }
          puVar1 = *p;
          *p = puVar1 + 1;
          bVar5 = puVar1[1];
          ppuVar4 = __ctype_b_loc();
          if (((*ppuVar4)[(int)(uint)bVar5] & 0x4000) == 0) {
            return 0;
          }
          charset[bVar5] = '\x01';
          *p = *p + 1;
        }
        else {
          charset[local_28] = '\x01';
          *p = *p + 1;
        }
      }
      break;
    case 2:
      if (local_28 == 0x5c) {
        puVar1 = *p;
        *p = puVar1 + 1;
        local_28 = puVar1[1];
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)(uint)local_28] & 0x4000) == 0) {
          return 0;
        }
      }
      if (local_28 == 0x5d) {
        return 1;
      }
      if (local_28 == 0x5c) {
        puVar1 = *p;
        *p = puVar1 + 1;
        local_28 = puVar1[1];
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)(uint)local_28] & 0x4000) == 0) {
          return 0;
        }
        charset[local_28] = '\x01';
        uStack_24 = 0;
        *p = *p + 1;
      }
      if (local_25 <= local_28) {
        ppuVar4 = __ctype_b_loc();
        if ((((((*ppuVar4)[(int)(uint)local_28] & 0x200) == 0) ||
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_25] & 0x200) == 0)) &&
            ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_28] & 0x800) == 0 ||
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_25] & 0x800) == 0)))) &&
           ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_28] & 0x100) == 0 ||
            (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_25] & 0x100) == 0)))) {
          return 0;
        }
        charset[local_26] = '\0';
        local_25 = local_25 + 1;
        while (bVar5 = local_25 + 1, local_25 <= local_28) {
          charset[(int)(bVar5 - 1)] = '\x01';
          local_25 = bVar5;
        }
        *p = *p + 1;
        uStack_24 = 0;
        local_25 = bVar5;
      }
      break;
    case 3:
      if (local_28 == 0x5b) {
        uStack_24 = 4;
        charset[0x5b] = '\x01';
        *p = *p + 1;
      }
      else {
        if (local_28 == 0x5d) {
          return 1;
        }
        if (local_28 == 0) {
          return 0;
        }
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)(uint)local_28] & 0x4000) == 0) {
          return 0;
        }
        charset[local_28] = '\x01';
        *p = *p + 1;
        uStack_24 = 0;
      }
      break;
    case 4:
      if (local_28 == 0x5d) {
        return 1;
      }
      uStack_24 = 0;
      charset[local_28] = '\x01';
      *p = *p + 1;
    }
  } while( true );
}

Assistant:

static int setcharset(unsigned char **p, unsigned char *charset)
{
  setcharset_state state = CURLFNM_SCHS_DEFAULT;
  unsigned char rangestart = 0;
  unsigned char lastchar   = 0;
  bool something_found = FALSE;
  unsigned char c;
  for(;;) {
    c = **p;
    switch(state) {
    case CURLFNM_SCHS_DEFAULT:
      if(ISALNUM(c)) { /* ASCII value */
        rangestart = c;
        charset[c] = 1;
        (*p)++;
        state = CURLFNM_SCHS_MAYRANGE;
        something_found = TRUE;
      }
      else if(c == ']') {
        if(something_found)
          return SETCHARSET_OK;
        else
          something_found = TRUE;
        state = CURLFNM_SCHS_RIGHTBR;
        charset[c] = 1;
        (*p)++;
      }
      else if(c == '[') {
        char c2 = *((*p)+1);
        if(c2 == ':') { /* there has to be a keyword */
          (*p) += 2;
          if(parsekeyword(p, charset)) {
            state = CURLFNM_SCHS_DEFAULT;
          }
          else
            return SETCHARSET_FAIL;
        }
        else {
          charset[c] = 1;
          (*p)++;
        }
        something_found = TRUE;
      }
      else if(c == '?' || c == '*') {
        something_found = TRUE;
        charset[c] = 1;
        (*p)++;
      }
      else if(c == '^' || c == '!') {
        if(!something_found) {
          if(charset[CURLFNM_NEGATE]) {
            charset[c] = 1;
            something_found = TRUE;
          }
          else
            charset[CURLFNM_NEGATE] = 1; /* negate charset */
        }
        else
          charset[c] = 1;
        (*p)++;
      }
      else if(c == '\\') {
        c = *(++(*p));
        if(ISPRINT((c))) {
          something_found = TRUE;
          state = CURLFNM_SCHS_MAYRANGE;
          charset[c] = 1;
          rangestart = c;
          (*p)++;
        }
        else
          return SETCHARSET_FAIL;
      }
      else if(c == '\0') {
        return SETCHARSET_FAIL;
      }
      else {
        charset[c] = 1;
        (*p)++;
        something_found = TRUE;
      }
      break;
    case CURLFNM_SCHS_MAYRANGE:
      if(c == '-') {
        charset[c] = 1;
        (*p)++;
        lastchar = '-';
        state = CURLFNM_SCHS_MAYRANGE2;
      }
      else if(c == '[') {
        state = CURLFNM_SCHS_DEFAULT;
      }
      else if(ISALNUM(c)) {
        charset[c] = 1;
        (*p)++;
      }
      else if(c == '\\') {
        c = *(++(*p));
        if(ISPRINT(c)) {
          charset[c] = 1;
          (*p)++;
        }
        else
          return SETCHARSET_FAIL;
      }
      else if(c == ']') {
        return SETCHARSET_OK;
      }
      else
        return SETCHARSET_FAIL;
      break;
    case CURLFNM_SCHS_MAYRANGE2:
      if(c == '\\') {
        c = *(++(*p));
        if(!ISPRINT(c))
          return SETCHARSET_FAIL;
      }
      if(c == ']') {
        return SETCHARSET_OK;
      }
      else if(c == '\\') {
        c = *(++(*p));
        if(ISPRINT(c)) {
          charset[c] = 1;
          state = CURLFNM_SCHS_DEFAULT;
          (*p)++;
        }
        else
          return SETCHARSET_FAIL;
      }
      if(c >= rangestart) {
        if((ISLOWER(c) && ISLOWER(rangestart)) ||
           (ISDIGIT(c) && ISDIGIT(rangestart)) ||
           (ISUPPER(c) && ISUPPER(rangestart))) {
          charset[lastchar] = 0;
          rangestart++;
          while(rangestart++ <= c)
            charset[rangestart-1] = 1;
          (*p)++;
          state = CURLFNM_SCHS_DEFAULT;
        }
        else
          return SETCHARSET_FAIL;
      }
      break;
    case CURLFNM_SCHS_RIGHTBR:
      if(c == '[') {
        state = CURLFNM_SCHS_RIGHTBRLEFTBR;
        charset[c] = 1;
        (*p)++;
      }
      else if(c == ']') {
        return SETCHARSET_OK;
      }
      else if(c == '\0') {
        return SETCHARSET_FAIL;
      }
      else if(ISPRINT(c)) {
        charset[c] = 1;
        (*p)++;
        state = CURLFNM_SCHS_DEFAULT;
      }
      else
        /* used 'goto fail' instead of 'return SETCHARSET_FAIL' to avoid a
         * nonsense warning 'statement not reached' at end of the fnc when
         * compiling on Solaris */
        goto fail;
      break;
    case CURLFNM_SCHS_RIGHTBRLEFTBR:
      if(c == ']') {
        return SETCHARSET_OK;
      }
      else {
        state  = CURLFNM_SCHS_DEFAULT;
        charset[c] = 1;
        (*p)++;
      }
      break;
    }
  }
fail:
  return SETCHARSET_FAIL;
}